

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
::move_into(hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
            *this,node *pNode)

{
  raw_node *prVar1;
  undefined8 uVar2;
  uint uVar3;
  raw_node *prVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = hash_key(this,(vec<2U,_float> *)pNode);
  prVar1 = (this->m_values).m_p;
  prVar4 = prVar1 + uVar3;
  if (prVar1[uVar3].m_bits[0xc] != '\0') {
    uVar5 = (this->m_values).m_size - 1;
    uVar7 = uVar3;
    do {
      uVar6 = uVar7 - 1;
      if (uVar7 == 0) {
        uVar6 = uVar5;
      }
      if (uVar6 == uVar3) {
        return;
      }
      prVar4 = prVar4 + -1;
      if (uVar7 == 0) {
        prVar4 = prVar1 + uVar5;
      }
      uVar7 = uVar6;
    } while (prVar4->m_bits[0xc] != '\0');
  }
  uVar2 = *(undefined8 *)&(pNode->super_value_type).second;
  *(undefined8 *)prVar4->m_bits = *(undefined8 *)(pNode->super_value_type).first.m_s;
  *(undefined8 *)(prVar4->m_bits + 8) = uVar2;
  pNode->state = '\0';
  this->m_num_valid = this->m_num_valid + 1;
  return;
}

Assistant:

inline void move_into(node* pNode)
        {
            int index = hash_key(pNode->first);
            node* pDst_node = &get_node(index);

            if (pDst_node->state)
            {
                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pDst_node = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pDst_node--;
                    }

                    if (index == orig_index)
                    {
                        CRNLIB_ASSERT(false);
                        return;
                    }

                    if (!pDst_node->state)
                    {
                        break;
                    }
                }
            }

            move_node(pDst_node, pNode);

            m_num_valid++;
        }